

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O1

void __thiscall Assimp::glTF2Importer::ImportMeshes(glTF2Importer *this,Asset *r)

{
  pointer *ppuVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  PrimitiveMode PVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  iterator iVar12;
  aiVector3D *paVar13;
  vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *pvVar14;
  vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *pvVar15;
  BufferView *pBVar16;
  vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *pvVar17;
  long lVar18;
  aiScene *paVar19;
  bool bVar20;
  glTF2Importer *pgVar21;
  iterator iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  pointer ppMVar27;
  aiMesh *paVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar29;
  aiVector3D *paVar30;
  pointer pRVar31;
  float *pfVar32;
  Logger *pLVar33;
  long *plVar34;
  aiAnimMesh **ppaVar35;
  aiAnimMesh *paVar36;
  Accessor *pAVar37;
  ulong *puVar38;
  aiFace *paVar39;
  uint **ppuVar40;
  uint *puVar41;
  undefined8 *puVar42;
  undefined4 *puVar43;
  aiMesh **ppaVar44;
  long lVar45;
  ulong uVar46;
  _func_int **pp_Var47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  int iVar51;
  char *pcVar52;
  aiMesh **ppaVar53;
  ulong uVar54;
  uint uVar55;
  char *pcVar56;
  size_t *psVar57;
  pointer pPVar58;
  aiFace *paVar59;
  ulong *puVar60;
  bool bVar61;
  aiMesh *aim;
  Tangent *tangents;
  uint k;
  aiVector3D *tangentDiff;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  aiMesh *local_108;
  ulong local_100;
  ulong local_f8;
  pointer local_f0;
  Indexer local_e8;
  ulong local_c8;
  uint local_bc;
  aiFace *local_b8;
  Mesh *local_b0;
  glTF2Importer *local_a8;
  ulong local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  aiMesh **local_78;
  iterator iStack_70;
  aiMesh **local_68;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_48;
  Asset *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_78 = (aiMesh **)0x0;
  iStack_70._M_current = (aiMesh **)0x0;
  local_68 = (aiMesh **)0x0;
  local_bc = 0;
  ppMVar27 = (r->meshes).mObjs.super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_a8 = this;
  local_40 = r;
  if (((long)(r->meshes).mObjs.super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar27 & 0x7fffffff8U) != 0) {
    local_48 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->meshOffsets;
    uVar49 = 0;
    do {
      local_b0 = ppMVar27[uVar49];
      iVar12._M_current =
           (local_a8->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar12._M_current ==
          (local_a8->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_48,iVar12,&local_bc);
      }
      else {
        *iVar12._M_current = local_bc;
        ppuVar1 = &(local_a8->meshOffsets).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      local_bc = local_bc +
                 (int)((ulong)((long)*(pointer *)
                                      ((long)&(local_b0->primitives).
                                              super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                              ._M_impl + 8) -
                              *(long *)&(local_b0->primitives).
                                        super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                        ._M_impl.super__Vector_impl_data) >> 8);
      pPVar58 = (local_b0->primitives).
                super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&(local_b0->primitives).
                   super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                   ._M_impl + 8) != pPVar58) {
        local_50 = &(local_b0->super_Object).name;
        local_38 = &(local_b0->super_Object).id;
        local_a0 = 0;
        local_100 = uVar49;
        do {
          uVar49 = local_a0;
          psVar57 = &local_e8.elemSize;
          paVar28 = (aiMesh *)operator_new(0x520);
          paVar28->mPrimitiveTypes = 0;
          paVar28->mNumVertices = 0;
          paVar28->mNumFaces = 0;
          memset(&paVar28->mVertices,0,0xcc);
          paVar28->mBones = (aiBone **)0x0;
          paVar28->mMaterialIndex = 0;
          (paVar28->mName).length = 0;
          (paVar28->mName).data[0] = '\0';
          memset((paVar28->mName).data + 1,0x1b,0x3ff);
          paVar28->mNumAnimMeshes = 0;
          paVar28->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar28->mMethod = 0;
          (paVar28->mAABB).mMin.x = 0.0;
          (paVar28->mAABB).mMin.y = 0.0;
          (paVar28->mAABB).mMin.z = 0.0;
          (paVar28->mAABB).mMax.x = 0.0;
          (paVar28->mAABB).mMax.y = 0.0;
          (paVar28->mAABB).mMax.z = 0.0;
          paVar28->mTextureCoords[0] = (aiVector3D *)0x0;
          paVar28->mTextureCoords[1] = (aiVector3D *)0x0;
          paVar28->mTextureCoords[2] = (aiVector3D *)0x0;
          paVar28->mTextureCoords[3] = (aiVector3D *)0x0;
          paVar28->mTextureCoords[4] = (aiVector3D *)0x0;
          paVar28->mTextureCoords[5] = (aiVector3D *)0x0;
          paVar28->mTextureCoords[6] = (aiVector3D *)0x0;
          paVar28->mTextureCoords[7] = (aiVector3D *)0x0;
          paVar28->mNumUVComponents[0] = 0;
          paVar28->mNumUVComponents[1] = 0;
          paVar28->mNumUVComponents[2] = 0;
          paVar28->mNumUVComponents[3] = 0;
          paVar28->mNumUVComponents[4] = 0;
          paVar28->mNumUVComponents[5] = 0;
          paVar28->mNumUVComponents[6] = 0;
          paVar28->mNumUVComponents[7] = 0;
          paVar28->mColors[0] = (aiColor4D *)0x0;
          paVar28->mColors[1] = (aiColor4D *)0x0;
          paVar28->mColors[2] = (aiColor4D *)0x0;
          paVar28->mColors[3] = (aiColor4D *)0x0;
          paVar28->mColors[4] = (aiColor4D *)0x0;
          paVar28->mColors[5] = (aiColor4D *)0x0;
          paVar28->mColors[6] = (aiColor4D *)0x0;
          paVar28->mColors[7] = (aiColor4D *)0x0;
          local_108 = paVar28;
          if (iStack_70._M_current == local_68) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_78,iStack_70,&local_108);
          }
          else {
            *iStack_70._M_current = paVar28;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
          paVar28 = local_108;
          pbVar29 = local_50;
          if ((local_b0->super_Object).name._M_string_length == 0) {
            pbVar29 = local_38;
          }
          uVar46 = pbVar29->_M_string_length;
          if (uVar46 < 0x400) {
            (local_108->mName).length = (ai_uint32)uVar46;
            memcpy((local_108->mName).data,(pbVar29->_M_dataplus)._M_p,uVar46);
            (paVar28->mName).data[uVar46] = '\0';
          }
          if (0x100 < (ulong)((long)*(pointer *)
                                     ((long)&(local_b0->primitives).
                                             super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                             ._M_impl + 8) -
                             *(long *)&(local_b0->primitives).
                                       super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                       ._M_impl.super__Vector_impl_data)) {
            uVar23 = (local_108->mName).length;
            (local_108->mName).data[uVar23] = '-';
            pcVar56 = (local_108->mName).data + (ulong)uVar23 + 1;
            uVar55 = 1;
            uVar46 = local_a0;
            if (((int)local_a0 < 0) && (1 < 0x3ff - uVar23)) {
              (local_108->mName).data[(ulong)uVar23 + 1] = '-';
              pcVar56 = (local_108->mName).data + (ulong)uVar23 + 2;
              uVar46 = (ulong)(uint)-(int)local_a0;
              uVar55 = 2;
            }
            iVar51 = 1000000000;
            bVar61 = false;
            do {
              pcVar52 = pcVar56;
              if (0x3ff - uVar23 <= uVar55) break;
              uVar54 = (ulong)(uint)((int)uVar46 >> 0x1f) << 0x20 | uVar46 & 0xffffffff;
              lVar45 = (long)uVar54 / (long)iVar51;
              uVar54 = (long)uVar54 % (long)iVar51 & 0xffffffff;
              if (((bVar61) || (iVar51 == 1)) || ((int)lVar45 != 0)) {
                pcVar52 = pcVar56 + 1;
                uVar55 = uVar55 + 1;
                *pcVar56 = (char)lVar45 + '0';
                bVar61 = true;
                if (iVar51 != 1) goto LAB_006635b4;
                bVar20 = false;
                iVar51 = 1;
                uVar46 = uVar54;
              }
              else {
                uVar54 = uVar46 & 0xffffffff;
LAB_006635b4:
                iVar51 = iVar51 / 10;
                bVar20 = true;
                uVar46 = uVar54;
              }
              pcVar56 = pcVar52;
            } while (bVar20);
            *pcVar52 = '\0';
            (local_108->mName).length = (local_108->mName).length + uVar55;
          }
          local_f0 = pPVar58 + uVar49;
          PVar9 = local_f0->mode;
          if (PVar9 - PrimitiveMode_LINES < 3) {
            uVar23 = 2;
LAB_0066361d:
            local_108->mPrimitiveTypes = local_108->mPrimitiveTypes | uVar23;
          }
          else {
            if (PVar9 - PrimitiveMode_TRIANGLES < 3) {
              uVar23 = 4;
              goto LAB_0066361d;
            }
            uVar23 = 1;
            if (PVar9 == PrimitiveMode_POINTS) goto LAB_0066361d;
          }
          pRVar31 = *(pointer *)
                     &(local_f0->attributes).position.
                      super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                      ._M_impl;
          if ((*(pointer *)
                ((long)&(local_f0->attributes).position.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                + 8) != pRVar31) &&
             (pRVar31->vector !=
              (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0)) {
            local_108->mNumVertices =
                 *(uint *)(*(long *)(*(long *)&(pRVar31->vector->
                                               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                               )._M_impl + (ulong)pRVar31->index * 8) + 0x70);
            puVar42 = *(undefined8 **)
                       &(local_f0->attributes).position.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                        ._M_impl;
            glTF2::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)(*(long *)*puVar42 + (ulong)*(uint *)(puVar42 + 1) * 8),
                       &local_108->mVertices);
          }
          pRVar31 = (local_f0->attributes).normal.
                    super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((*(pointer *)
                ((long)&(local_f0->attributes).normal.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                + 8) != pRVar31) &&
             (pRVar31->vector !=
              (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0)) {
            glTF2::Accessor::ExtractData<aiVector3t<float>>
                      (*(Accessor **)
                        (*(long *)&(pRVar31->vector->
                                   super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                   )._M_impl + (ulong)pRVar31->index * 8),&local_108->mNormals);
            pRVar31 = (local_f0->attributes).tangent.
                      super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((*(pointer *)
                  ((long)&(local_f0->attributes).tangent.
                          super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                  + 8) != pRVar31) &&
               (pRVar31->vector !=
                (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0)) {
              local_e8.accessor = (Accessor *)0x0;
              glTF2::Accessor::ExtractData<(anonymous_namespace)::Tangent>
                        (*(Accessor **)
                          (*(long *)&(pRVar31->vector->
                                     super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                     )._M_impl + (ulong)pRVar31->index * 8),(Tangent **)&local_e8);
              paVar28 = local_108;
              uVar49 = (ulong)local_108->mNumVertices;
              paVar30 = (aiVector3D *)operator_new__(uVar49 * 0xc);
              if (uVar49 != 0) {
                memset(paVar30,0,((uVar49 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar28->mTangents = paVar30;
              uVar49 = (ulong)paVar28->mNumVertices;
              paVar30 = (aiVector3D *)operator_new__(uVar49 * 0xc);
              if (uVar49 != 0) {
                memset(paVar30,0,((uVar49 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar28->mBitangents = paVar30;
              if (local_108->mNumVertices != 0) {
                lVar45 = 0;
                uVar49 = 0;
                pAVar37 = local_e8.accessor;
                do {
                  paVar30 = local_108->mTangents;
                  *(int *)((long)&paVar30->z + lVar45) =
                       (int)*(size_t *)&(pAVar37->super_Object).index;
                  *(_func_int ***)((long)&paVar30->x + lVar45) =
                       (pAVar37->super_Object)._vptr_Object;
                  paVar30 = local_108->mNormals;
                  paVar13 = local_108->mBitangents;
                  fVar2 = *(float *)((long)&paVar30->x + lVar45);
                  fVar3 = *(float *)((long)&paVar30->y + lVar45);
                  fVar4 = (float)(pAVar37->super_Object).index;
                  fVar5 = *(float *)((long)&paVar30->z + lVar45);
                  fVar6 = *(float *)&(pAVar37->super_Object)._vptr_Object;
                  fVar7 = *(float *)((long)&(pAVar37->super_Object)._vptr_Object + 4);
                  fVar8 = (float)(pAVar37->super_Object).oIndex;
                  *(ulong *)((long)&paVar13->x + lVar45) =
                       CONCAT44((fVar5 * fVar6 - fVar4 * fVar2) * fVar8,
                                (fVar3 * fVar4 - fVar7 * fVar5) * fVar8);
                  *(float *)((long)&paVar13->z + lVar45) = (fVar2 * fVar7 - fVar6 * fVar3) * fVar8;
                  uVar49 = uVar49 + 1;
                  pAVar37 = (Accessor *)&(pAVar37->super_Object).id;
                  lVar45 = lVar45 + 0xc;
                } while (uVar49 < local_108->mNumVertices);
              }
              if (local_e8.accessor != (Accessor *)0x0) {
                operator_delete__(local_e8.accessor);
              }
            }
          }
          pRVar31 = (local_f0->attributes).color.
                    super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(local_f0->attributes).color.
                       super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
               + 8) != pRVar31) {
            lVar45 = 0x30;
            uVar49 = 0;
            do {
              pAVar37 = *(Accessor **)
                         (**(long **)((long)&pRVar31[-6].vector + lVar45 * 2) +
                         (ulong)*(uint *)((long)pRVar31 + lVar45 * 2 + -0x58) * 8);
              if (pAVar37->count == (ulong)local_108->mNumVertices) {
                glTF2::Accessor::ExtractData<aiColor4t<float>>
                          (pAVar37,(aiColor4t<float> **)((long)local_108->mColors + lVar45 + -0x30))
                ;
              }
              else {
                pLVar33 = DefaultLogger::get();
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_98,"Color stream size in mesh \"",local_50);
                plVar34 = (long *)std::__cxx11::string::append(local_98._M_local_buf);
                pAVar37 = (Accessor *)(plVar34 + 2);
                if ((Accessor *)*plVar34 == pAVar37) {
                  local_e8.elemSize = (size_t)(pAVar37->super_Object)._vptr_Object;
                  local_e8.stride = plVar34[3];
                  local_e8.accessor = (Accessor *)psVar57;
                }
                else {
                  local_e8.elemSize = (size_t)(pAVar37->super_Object)._vptr_Object;
                  local_e8.accessor = (Accessor *)*plVar34;
                }
                local_e8.data = (uint8_t *)plVar34[1];
                *plVar34 = (long)pAVar37;
                plVar34[1] = 0;
                *(undefined1 *)(plVar34 + 2) = 0;
                Logger::warn(pLVar33,(char *)local_e8.accessor);
                if (local_e8.accessor != (Accessor *)psVar57) {
                  operator_delete(local_e8.accessor,local_e8.elemSize + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98._M_allocated_capacity != &local_88) {
                  operator_delete((void *)local_98._M_allocated_capacity,
                                  local_88._M_allocated_capacity + 1);
                }
              }
              if (6 < uVar49) break;
              uVar49 = uVar49 + 1;
              pRVar31 = (local_f0->attributes).color.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar45 = lVar45 + 8;
            } while (uVar49 < (ulong)((long)*(pointer *)
                                             ((long)&(local_f0->attributes).color.
                                                                                                          
                                                  super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                             + 8) - (long)pRVar31 >> 4));
          }
          pRVar31 = (local_f0->attributes).texcoord.
                    super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(local_f0->attributes).texcoord.
                       super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
               + 8) != pRVar31) {
            uVar49 = 0;
            do {
              pAVar37 = *(Accessor **)
                         (*(long *)&((pRVar31[uVar49].vector)->
                                    super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                    )._M_impl + (ulong)pRVar31[uVar49].index * 8);
              if (pAVar37->count == (ulong)local_108->mNumVertices) {
                glTF2::Accessor::ExtractData<aiVector3t<float>>
                          (pAVar37,local_108->mTextureCoords + uVar49);
                lVar45 = *(long *)&(local_f0->attributes).texcoord.
                                   super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                   ._M_impl.super__Vector_impl_data;
                local_108->mNumUVComponents[uVar49] =
                     *(uint *)(&DAT_0082cbc8 +
                              (ulong)*(uint *)(*(long *)(**(long **)(lVar45 + uVar49 * 0x10) +
                                                        (ulong)*(uint *)(lVar45 + 8 + uVar49 * 0x10)
                                                        * 8) + 0x78) * 0x10);
                if (local_108->mNumVertices != 0) {
                  pfVar32 = &local_108->mTextureCoords[uVar49]->y;
                  uVar46 = 0;
                  do {
                    *pfVar32 = 1.0 - *pfVar32;
                    uVar46 = uVar46 + 1;
                    pfVar32 = pfVar32 + 3;
                  } while (uVar46 < local_108->mNumVertices);
                }
              }
              else {
                pLVar33 = DefaultLogger::get();
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_98,"Texcoord stream size in mesh \"",local_50);
                plVar34 = (long *)std::__cxx11::string::append(local_98._M_local_buf);
                pAVar37 = (Accessor *)(plVar34 + 2);
                if ((Accessor *)*plVar34 == pAVar37) {
                  local_e8.elemSize = (size_t)(pAVar37->super_Object)._vptr_Object;
                  local_e8.stride = plVar34[3];
                  local_e8.accessor = (Accessor *)psVar57;
                }
                else {
                  local_e8.elemSize = (size_t)(pAVar37->super_Object)._vptr_Object;
                  local_e8.accessor = (Accessor *)*plVar34;
                }
                local_e8.data = (uint8_t *)plVar34[1];
                *plVar34 = (long)pAVar37;
                plVar34[1] = 0;
                *(undefined1 *)(plVar34 + 2) = 0;
                Logger::warn(pLVar33,(char *)local_e8.accessor);
                if (local_e8.accessor != (Accessor *)psVar57) {
                  operator_delete(local_e8.accessor,local_e8.elemSize + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98._M_allocated_capacity != &local_88) {
                  operator_delete((void *)local_98._M_allocated_capacity,
                                  local_88._M_allocated_capacity + 1);
                }
              }
              if (6 < uVar49) break;
              uVar49 = uVar49 + 1;
              pRVar31 = (local_f0->attributes).texcoord.
                        super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar49 < (ulong)((long)*(pointer *)
                                             ((long)&(local_f0->attributes).texcoord.
                                                                                                          
                                                  super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                                             + 8) - (long)pRVar31 >> 4));
          }
          uVar49 = local_100;
          paVar28 = local_108;
          lVar45 = (long)*(pointer *)
                          ((long)&(local_f0->targets).
                                  super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                  ._M_impl + 8) -
                   *(long *)&(local_f0->targets).
                             super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                             ._M_impl.super__Vector_impl_data;
          if (lVar45 != 0) {
            lVar45 = lVar45 >> 3;
            local_108->mNumAnimMeshes = (int)lVar45 * 0x38e38e39;
            ppaVar35 = (aiAnimMesh **)operator_new__(lVar45 * 0x71c71c71c71c71c8 & 0x7fffffff8);
            paVar28->mAnimMeshes = ppaVar35;
            if (*(pointer *)
                 ((long)&(local_f0->targets).
                         super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                         ._M_impl + 8) !=
                (local_f0->targets).
                super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar46 = 0;
              do {
                paVar36 = aiCreateAnimMesh(local_108);
                local_108->mAnimMeshes[uVar46] = paVar36;
                paVar36 = local_108->mAnimMeshes[uVar46];
                plVar34 = (long *)(*(long *)&(local_f0->targets).
                                             super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                             ._M_impl.super__Vector_impl_data + uVar46 * 0x48);
                if (plVar34[1] != *plVar34) {
                  local_e8.accessor = (Accessor *)0x0;
                  glTF2::Accessor::ExtractData<aiVector3t<float>>
                            (*(Accessor **)
                              (**(long **)*plVar34 +
                              (ulong)*(uint *)((undefined8 *)*plVar34 + 1) * 8),
                             (aiVector3t<float> **)&local_e8);
                  if (local_108->mNumVertices != 0) {
                    lVar45 = 8;
                    uVar49 = 0;
                    do {
                      paVar30 = paVar36->mVertices;
                      *(float *)((long)paVar30 + lVar45 + -8) =
                           *(float *)((long)local_e8.accessor + lVar45 + -8) +
                           *(float *)((long)paVar30 + lVar45 + -8);
                      *(float *)((long)paVar30 + lVar45 + -4) =
                           *(float *)((long)local_e8.accessor + lVar45 + -4) +
                           *(float *)((long)paVar30 + lVar45 + -4);
                      *(float *)((long)&paVar30->x + lVar45) =
                           *(float *)((long)&((local_e8.accessor)->super_Object)._vptr_Object +
                                     lVar45) + *(float *)((long)&paVar30->x + lVar45);
                      uVar49 = uVar49 + 1;
                      lVar45 = lVar45 + 0xc;
                    } while (uVar49 < local_108->mNumVertices);
                  }
                  if (local_e8.accessor != (Accessor *)0x0) {
                    operator_delete__(local_e8.accessor);
                  }
                }
                if (plVar34[4] != plVar34[3]) {
                  local_e8.accessor = (Accessor *)0x0;
                  glTF2::Accessor::ExtractData<aiVector3t<float>>
                            (*(Accessor **)
                              (**(long **)plVar34[3] +
                              (ulong)*(uint *)((undefined8 *)plVar34[3] + 1) * 8),
                             (aiVector3t<float> **)&local_e8);
                  if (local_108->mNumVertices != 0) {
                    lVar45 = 8;
                    uVar49 = 0;
                    do {
                      paVar30 = paVar36->mNormals;
                      *(float *)((long)paVar30 + lVar45 + -8) =
                           *(float *)((long)local_e8.accessor + lVar45 + -8) +
                           *(float *)((long)paVar30 + lVar45 + -8);
                      *(float *)((long)paVar30 + lVar45 + -4) =
                           *(float *)((long)local_e8.accessor + lVar45 + -4) +
                           *(float *)((long)paVar30 + lVar45 + -4);
                      *(float *)((long)&paVar30->x + lVar45) =
                           *(float *)((long)&((local_e8.accessor)->super_Object)._vptr_Object +
                                     lVar45) + *(float *)((long)&paVar30->x + lVar45);
                      uVar49 = uVar49 + 1;
                      lVar45 = lVar45 + 0xc;
                    } while (uVar49 < local_108->mNumVertices);
                  }
                  if (local_e8.accessor != (Accessor *)0x0) {
                    operator_delete__(local_e8.accessor);
                  }
                }
                if (plVar34[7] != plVar34[6]) {
                  local_e8.accessor = (Accessor *)0x0;
                  puVar42 = *(undefined8 **)
                             &(local_f0->attributes).tangent.
                              super__Vector_base<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
                              ._M_impl.super__Vector_impl_data;
                  glTF2::Accessor::ExtractData<(anonymous_namespace)::Tangent>
                            (*(Accessor **)(*(long *)*puVar42 + (ulong)*(uint *)(puVar42 + 1) * 8),
                             (Tangent **)&local_e8);
                  local_98._M_allocated_capacity = 0;
                  glTF2::Accessor::ExtractData<aiVector3t<float>>
                            (*(Accessor **)
                              (**(long **)plVar34[6] +
                              (ulong)*(uint *)((undefined8 *)plVar34[6] + 1) * 8),
                             (aiVector3t<float> **)&local_98._M_allocated_capacity);
                  if (local_108->mNumVertices != 0) {
                    lVar45 = 0;
                    uVar49 = 0;
                    pAVar37 = local_e8.accessor;
                    do {
                      *(float *)&(pAVar37->super_Object)._vptr_Object =
                           *(float *)(local_98._M_allocated_capacity + lVar45) +
                           *(float *)&(pAVar37->super_Object)._vptr_Object;
                      *(float *)((long)&(pAVar37->super_Object)._vptr_Object + 4) =
                           *(float *)((char *)(local_98._M_allocated_capacity + 4) + lVar45) +
                           *(float *)((long)&(pAVar37->super_Object)._vptr_Object + 4);
                      (pAVar37->super_Object).index =
                           (int)(*(float *)((char *)(local_98._M_allocated_capacity + 8) + lVar45) +
                                (float)(pAVar37->super_Object).index);
                      paVar30 = paVar36->mTangents;
                      *(int *)((long)&paVar30->z + lVar45) =
                           (int)*(size_t *)&(pAVar37->super_Object).index;
                      *(_func_int ***)((long)&paVar30->x + lVar45) =
                           (pAVar37->super_Object)._vptr_Object;
                      paVar30 = paVar36->mNormals;
                      paVar13 = paVar36->mBitangents;
                      fVar2 = *(float *)((long)&paVar30->x + lVar45);
                      fVar3 = *(float *)((long)&paVar30->y + lVar45);
                      fVar4 = (float)(pAVar37->super_Object).index;
                      fVar5 = *(float *)((long)&paVar30->z + lVar45);
                      fVar6 = *(float *)&(pAVar37->super_Object)._vptr_Object;
                      fVar7 = *(float *)((long)&(pAVar37->super_Object)._vptr_Object + 4);
                      fVar8 = (float)(pAVar37->super_Object).oIndex;
                      *(ulong *)((long)&paVar13->x + lVar45) =
                           CONCAT44((fVar5 * fVar6 - fVar4 * fVar2) * fVar8,
                                    (fVar3 * fVar4 - fVar7 * fVar5) * fVar8);
                      *(float *)((long)&paVar13->z + lVar45) =
                           (fVar2 * fVar7 - fVar6 * fVar3) * fVar8;
                      uVar49 = uVar49 + 1;
                      lVar45 = lVar45 + 0xc;
                      pAVar37 = (Accessor *)&(pAVar37->super_Object).id;
                    } while (uVar49 < local_108->mNumVertices);
                  }
                  if (local_e8.accessor != (Accessor *)0x0) {
                    operator_delete__(local_e8.accessor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_98._M_allocated_capacity !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    operator_delete__((void *)local_98._M_allocated_capacity);
                  }
                }
                lVar45 = *(long *)&(local_b0->weights).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data;
                if (uVar46 < (ulong)((long)*(pointer *)
                                            ((long)&(local_b0->weights).
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl + 8) - lVar45 >> 2)) {
                  paVar36->mWeight = *(float *)(lVar45 + uVar46 * 4);
                }
                uVar46 = uVar46 + 1;
                uVar49 = local_100;
              } while (uVar46 < (ulong)(((long)*(pointer *)
                                                ((long)&(local_f0->targets).
                                                                                                                
                                                  super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                                  ._M_impl + 8) -
                                         *(long *)&(local_f0->targets).
                                                                                                      
                                                  super__Vector_base<glTF2::Mesh::Primitive::Target,_std::allocator<glTF2::Mesh::Primitive::Target>_>
                                                  ._M_impl.super__Vector_impl_data >> 3) *
                                       -0x71c71c71c71c71c7));
            }
          }
          pvVar14 = (local_f0->indices).vector;
          if (pvVar14 == (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
            PVar9 = local_f0->mode;
            if (PrimitiveMode_TRIANGLE_FAN < PVar9) goto switchD_00663fe8_default;
            uVar23 = local_108->mNumVertices;
            uVar49 = (ulong)uVar23;
            switch(PVar9) {
            case PrimitiveMode_POINTS:
              puVar38 = (ulong *)operator_new__(uVar49 * 0x10 + 8);
              *puVar38 = uVar49;
              paVar59 = (aiFace *)(puVar38 + 1);
              uVar46 = uVar49;
              if (uVar23 != 0) {
                paVar39 = paVar59;
                do {
                  paVar39->mNumIndices = 0;
                  paVar39->mIndices = (uint *)0x0;
                  paVar39 = paVar39 + 1;
                } while (paVar39 != paVar59 + uVar49);
                uVar54 = 0;
                do {
                  *(undefined4 *)(puVar38 + 1) = 1;
                  puVar43 = (undefined4 *)operator_new__(4);
                  puVar38[2] = (ulong)puVar43;
                  *puVar43 = (int)uVar54;
                  uVar54 = uVar54 + 1;
                  puVar38 = puVar38 + 2;
                } while (uVar49 != uVar54);
              }
              break;
            case PrimitiveMode_LINES:
              uVar55 = uVar23;
              if ((uVar23 & 0xfffffffe) != uVar23) {
                pLVar33 = DefaultLogger::get();
                Logger::warn(pLVar33,
                             "The number of vertices was not compatible with the LINES mode. Some vertices were dropped."
                            );
                uVar55 = uVar23 & 0xfffffffe;
              }
              uVar46 = (ulong)(uVar23 >> 1);
              puVar38 = (ulong *)operator_new__(uVar46 * 0x10 + 8);
              *puVar38 = uVar46;
              paVar59 = (aiFace *)(puVar38 + 1);
              if (1 < uVar23) {
                paVar39 = paVar59;
                do {
                  paVar39->mNumIndices = 0;
                  paVar39->mIndices = (uint *)0x0;
                  paVar39 = paVar39 + 1;
                } while (paVar39 != paVar59 + uVar46);
              }
              if (uVar55 != 0) {
                uVar23 = 0;
                do {
                  paVar59[uVar23 >> 1].mNumIndices = 2;
                  puVar41 = (uint *)operator_new__(8);
                  paVar59[uVar23 >> 1].mIndices = puVar41;
                  *puVar41 = uVar23;
                  puVar41[1] = uVar23 + 1;
                  uVar23 = uVar23 + 2;
                } while (uVar23 < uVar55);
              }
              break;
            default:
              uVar55 = uVar23 - (PVar9 == PrimitiveMode_LINE_STRIP);
              uVar46 = (ulong)uVar55;
              puVar38 = (ulong *)operator_new__(uVar46 * 0x10 + 8);
              *puVar38 = uVar46;
              paVar59 = (aiFace *)(puVar38 + 1);
              if (uVar55 != 0) {
                paVar39 = paVar59;
                do {
                  paVar39->mNumIndices = 0;
                  paVar39->mIndices = (uint *)0x0;
                  paVar39 = paVar39 + 1;
                } while (paVar39 != paVar59 + uVar46);
              }
              paVar59->mNumIndices = 2;
              puVar42 = (undefined8 *)operator_new__(8);
              puVar38[2] = (ulong)puVar42;
              *puVar42 = 0x100000000;
              local_c8 = uVar46;
              if (2 < uVar23) {
                puVar60 = puVar38 + 4;
                uVar46 = 2;
                do {
                  uVar10 = *(undefined4 *)(puVar60[-2] + 4);
                  *(undefined4 *)(puVar60 + -1) = 2;
                  puVar43 = (undefined4 *)operator_new__(8);
                  *puVar60 = (ulong)puVar43;
                  *puVar43 = uVar10;
                  puVar43[1] = (int)uVar46;
                  uVar46 = uVar46 + 1;
                  puVar60 = puVar60 + 2;
                } while (uVar49 != uVar46);
              }
              if (local_f0->mode == PrimitiveMode_LINE_LOOP) {
                uVar55 = *(uint *)(puVar38[(ulong)(uVar23 - 2) * 2 + 2] + 4);
                uVar26 = *(uint *)puVar38[2];
                paVar59[uVar23 - 1].mNumIndices = 2;
                puVar41 = (uint *)operator_new__(8);
                paVar59[uVar23 - 1].mIndices = puVar41;
                *puVar41 = uVar55;
                puVar41[1] = uVar26;
                uVar46 = local_c8;
                break;
              }
              goto LAB_00664425;
            case PrimitiveMode_TRIANGLES:
              uVar46 = uVar49 / 3;
              uVar55 = uVar23;
              if (uVar46 * 3 != uVar49) {
                pLVar33 = DefaultLogger::get();
                Logger::warn(pLVar33,
                             "The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped."
                            );
                uVar55 = (uVar23 / 3) * 3;
              }
              puVar38 = (ulong *)operator_new__(uVar46 * 0x10 + 8);
              *puVar38 = uVar46;
              paVar59 = (aiFace *)(puVar38 + 1);
              if (2 < uVar23) {
                paVar39 = paVar59;
                do {
                  paVar39->mNumIndices = 0;
                  paVar39->mIndices = (uint *)0x0;
                  paVar39 = paVar39 + 1;
                } while (paVar39 != paVar59 + uVar46);
              }
              if (uVar55 != 0) {
                uVar23 = 0;
                do {
                  uVar49 = (ulong)uVar23 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                  *(undefined4 *)((long)&paVar59->mNumIndices + uVar49) = 3;
                  puVar41 = (uint *)operator_new__(0xc);
                  *(uint **)((long)&paVar59->mIndices + uVar49) = puVar41;
                  *puVar41 = uVar23;
                  puVar41[1] = uVar23 + 1;
                  puVar41[2] = uVar23 + 2;
                  uVar23 = uVar23 + 3;
                } while (uVar23 < uVar55);
              }
              break;
            case PrimitiveMode_TRIANGLE_STRIP:
              uVar23 = uVar23 - 2;
              uVar49 = (ulong)uVar23;
              puVar38 = (ulong *)operator_new__(uVar49 * 0x10 + 8);
              *puVar38 = uVar49;
              paVar59 = (aiFace *)(puVar38 + 1);
              if (uVar23 != 0) {
                paVar39 = paVar59;
                do {
                  paVar39->mNumIndices = 0;
                  paVar39->mIndices = (uint *)0x0;
                  paVar39 = paVar39 + 1;
                } while (paVar39 != paVar59 + uVar49);
                uVar46 = 0;
                do {
                  uVar54 = uVar46 + 1;
                  *(undefined4 *)(puVar38 + 1) = 3;
                  if ((uVar46 & 1) == 0) {
                    puVar43 = (undefined4 *)operator_new__(0xc);
                    uVar48 = uVar46;
                    uVar50 = uVar54;
                  }
                  else {
                    puVar43 = (undefined4 *)operator_new__(0xc);
                    uVar48 = uVar54;
                    uVar50 = uVar46;
                  }
                  puVar38[2] = (ulong)puVar43;
                  *puVar43 = (int)uVar48;
                  puVar43[1] = (int)uVar50;
                  puVar43[2] = (int)uVar46 + 2;
                  uVar46 = uVar54;
                  puVar38 = puVar38 + 2;
                } while (uVar49 != uVar54);
              }
              uVar46 = (ulong)uVar23;
              break;
            case PrimitiveMode_TRIANGLE_FAN:
              uVar49 = (ulong)(uVar23 - 2);
              local_f8 = uVar49;
              puVar38 = (ulong *)operator_new__(uVar49 * 0x10 + 8);
              *puVar38 = local_f8;
              paVar59 = (aiFace *)(puVar38 + 1);
              if ((int)local_f8 != 0) {
                paVar39 = paVar59;
                do {
                  paVar39->mNumIndices = 0;
                  paVar39->mIndices = (uint *)0x0;
                  paVar39 = paVar39 + 1;
                } while (paVar39 != paVar59 + uVar49);
              }
              paVar59->mNumIndices = 3;
              puVar42 = (undefined8 *)operator_new__(0xc);
              puVar38[2] = (ulong)puVar42;
              *puVar42 = 0x100000000;
              *(undefined4 *)(puVar42 + 1) = 2;
              uVar46 = local_f8;
              if ((uint)local_f8 < 2) break;
              lVar45 = 0x10;
              iVar51 = 3;
              local_b8 = paVar59;
              do {
                uVar10 = *(undefined4 *)puVar38[2];
                uVar11 = *(undefined4 *)(*(long *)((long)puVar38 + lVar45) + 8);
                *(undefined4 *)((long)puVar38 + lVar45 + 8) = 3;
                puVar43 = (undefined4 *)operator_new__(0xc);
                *(undefined4 **)((long)puVar38 + lVar45 + 0x10) = puVar43;
                *puVar43 = uVar10;
                puVar43[1] = uVar11;
                puVar43[2] = iVar51;
                lVar45 = lVar45 + 0x10;
                iVar51 = iVar51 + 1;
              } while (uVar49 * 0x10 != lVar45);
              uVar23 = (uint)local_f8;
              paVar59 = local_b8;
              uVar49 = local_100;
              goto LAB_00664ba6;
            }
LAB_00664acb:
            uVar23 = (uint)uVar46;
            uVar49 = local_100;
            goto LAB_00664ba6;
          }
          local_f8 = *(ulong *)(*(long *)(*(long *)&(pvVar14->
                                                                                                        
                                                  super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                                  )._M_impl + (ulong)(local_f0->indices).index * 8)
                               + 0x70);
          pAVar37 = *(Accessor **)
                     (*(long *)&(((local_f0->indices).vector)->
                                super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                )._M_impl + (ulong)(local_f0->indices).index * 8);
          pvVar15 = (pAVar37->bufferView).vector;
          if (pvVar15 == (vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *)0x0) {
LAB_00663f6f:
            local_e8.data = (uint8_t *)0x0;
          }
          else {
            pBVar16 = (pvVar15->
                      super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start[(pAVar37->bufferView).index];
            pvVar17 = (pBVar16->buffer).vector;
            if (pvVar17 == (vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *)0x0)
            goto LAB_00663f6f;
            lVar45 = *(long *)(*(long *)&pvVar17->
                                         super__Vector_base<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_>
                              + (ulong)(pBVar16->buffer).index * 8);
            lVar18 = *(long *)(lVar45 + 0x70);
            if (lVar18 == 0) goto LAB_00663f6f;
            uVar46 = pBVar16->byteOffset + pAVar37->byteOffset;
            puVar38 = *(ulong **)(lVar45 + 0x68);
            if (puVar38 == (ulong *)0x0) {
LAB_00664808:
              local_e8.data = (uint8_t *)(lVar18 + uVar46);
            }
            else {
              uVar54 = *puVar38;
              bVar61 = true;
              local_e8.data = (uint8_t *)(uVar46 - uVar54);
              if ((uVar54 <= uVar46) && (uVar46 < uVar54 + puVar38[3])) {
                local_e8.data = local_e8.data + puVar38[2];
                bVar61 = false;
              }
              if (bVar61) goto LAB_00664808;
            }
          }
          iVar51 = *(int *)(&DAT_0082cbc8 + (ulong)pAVar37->type * 0x10);
          local_e8.accessor = pAVar37;
          uVar23 = glTF2::ComponentTypeSize(pAVar37->componentType);
          uVar54 = local_f8;
          local_e8.elemSize = (size_t)(uVar23 * iVar51);
          pvVar15 = (pAVar37->bufferView).vector;
          local_e8.stride = local_e8.elemSize;
          if ((pvVar15 != (vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *)0x0)
             && (pp_Var47 = (_func_int **)
                            (ulong)(pvVar15->
                                   super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start
                                   [(pAVar37->bufferView).index]->byteStride,
                pp_Var47 != (_func_int **)0x0)) {
            local_e8.stride = (size_t)pp_Var47;
          }
          if (local_e8.data == (uint8_t *)0x0) {
            __assert_fail("data.IsValid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF2/glTF2Importer.cpp"
                          ,0x1e3,"void Assimp::glTF2Importer::ImportMeshes(glTF2::Asset &)");
          }
          switch(local_f0->mode) {
          case PrimitiveMode_POINTS:
            uVar46 = local_f8 * 0x10 + 8;
            if (0xfffffffffffffff < local_f8) {
              uVar46 = 0xffffffffffffffff;
            }
            puVar38 = (ulong *)operator_new__(uVar46);
            uVar46 = local_f8;
            *puVar38 = local_f8;
            paVar59 = (aiFace *)(puVar38 + 1);
            if (local_f8 != 0) {
              paVar39 = paVar59;
              do {
                paVar39->mNumIndices = 0;
                paVar39->mIndices = (uint *)0x0;
                paVar39 = paVar39 + 1;
              } while (paVar39 != paVar59 + uVar54);
              uVar23 = 1;
              uVar49 = 0;
              do {
                uVar55 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar23 - 1);
                paVar59[uVar49].mNumIndices = 1;
                puVar41 = (uint *)operator_new__(4);
                paVar59[uVar49].mIndices = puVar41;
                *puVar41 = uVar55;
                uVar49 = (ulong)uVar23;
                uVar23 = uVar23 + 1;
              } while (uVar49 < uVar46);
              goto LAB_00664acb;
            }
            uVar46 = 0;
            break;
          case PrimitiveMode_LINES:
            uVar46 = local_f8 & 0xfffffffffffffffe;
            uVar49 = local_f8;
            if (uVar46 != local_f8) {
              pLVar33 = DefaultLogger::get();
              Logger::warn(pLVar33,
                           "The number of vertices was not compatible with the LINES mode. Some vertices were dropped."
                          );
              uVar49 = uVar46;
            }
            uVar46 = local_f8 >> 1;
            local_c8 = uVar46;
            puVar38 = (ulong *)operator_new__(-(ulong)(local_f8 >> 0x3d != 0) | uVar46 * 0x10 | 8);
            *puVar38 = local_c8;
            paVar59 = (aiFace *)(puVar38 + 1);
            if (1 < local_f8) {
              paVar39 = paVar59;
              do {
                paVar39->mNumIndices = 0;
                paVar39->mIndices = (uint *)0x0;
                paVar39 = paVar39 + 1;
              } while (paVar39 != paVar59 + uVar46);
            }
            if (uVar49 != 0) {
              uVar23 = 2;
              do {
                uVar25 = uVar23 - 2 >> 1;
                uVar55 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar23 - 2);
                uVar26 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar23 - 1);
                paVar59[uVar25].mNumIndices = 2;
                puVar41 = (uint *)operator_new__(8);
                paVar59[uVar25].mIndices = puVar41;
                *puVar41 = uVar55;
                puVar41[1] = uVar26;
                uVar46 = (ulong)uVar23;
                uVar23 = uVar23 + 2;
              } while (uVar46 < uVar49);
            }
            goto LAB_00664425;
          case PrimitiveMode_LINE_LOOP:
          case PrimitiveMode_LINE_STRIP:
            uVar46 = local_f8 - (local_f0->mode == PrimitiveMode_LINE_STRIP);
            uVar49 = uVar46 * 0x10 + 8;
            if (0xfffffffffffffff < uVar46) {
              uVar49 = 0xffffffffffffffff;
            }
            local_c8 = uVar46;
            puVar38 = (ulong *)operator_new__(uVar49);
            *puVar38 = local_c8;
            paVar59 = (aiFace *)(puVar38 + 1);
            if (local_c8 != 0) {
              paVar39 = paVar59;
              do {
                paVar39->mNumIndices = 0;
                paVar39->mIndices = (uint *)0x0;
                paVar39 = paVar39 + 1;
              } while (paVar39 != paVar59 + uVar46);
            }
            uVar23 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,0);
            uVar55 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,1);
            paVar59->mNumIndices = 2;
            puVar41 = (uint *)operator_new__(8);
            puVar38[2] = (ulong)puVar41;
            *puVar41 = uVar23;
            puVar41[1] = uVar55;
            if (2 < local_f8) {
              uVar23 = 3;
              do {
                uVar55 = *(uint *)(puVar38[(ulong)(uVar23 - 3) * 2 + 2] + 4);
                uVar26 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar23 - 1);
                paVar59[uVar23 - 2].mNumIndices = 2;
                puVar41 = (uint *)operator_new__(8);
                paVar59[uVar23 - 2].mIndices = puVar41;
                *puVar41 = uVar55;
                puVar41[1] = uVar26;
                uVar49 = (ulong)uVar23;
                uVar23 = uVar23 + 1;
              } while (uVar49 < local_f8);
            }
            uVar49 = local_f8;
            if (local_f0->mode == PrimitiveMode_LINE_LOOP) {
              uVar23 = *(uint *)(puVar38[local_f8 * 2 + -2] + 4);
              uVar55 = *(uint *)puVar38[2];
              *(undefined4 *)(puVar38 + local_f8 * 2 + -1) = 2;
              puVar41 = (uint *)operator_new__(8);
              paVar59[uVar49 - 1].mIndices = puVar41;
              *puVar41 = uVar23;
              puVar41[1] = uVar55;
            }
LAB_00664425:
            uVar23 = (uint)local_c8;
            uVar49 = local_100;
            goto LAB_00664ba6;
          case PrimitiveMode_TRIANGLES:
            local_c8 = local_f8 / 3;
            uVar46 = local_c8 * 3;
            local_58 = local_f8;
            if (uVar46 != local_f8) {
              pLVar33 = DefaultLogger::get();
              Logger::warn(pLVar33,
                           "The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped."
                          );
              local_58 = uVar46;
            }
            uVar54 = local_c8;
            uVar46 = local_c8 * 0x10 + 8;
            if (2 < (uint)(local_f8 >> 0x3c)) {
              uVar46 = 0xffffffffffffffff;
            }
            puVar38 = (ulong *)operator_new__(uVar46);
            *puVar38 = local_c8;
            paVar59 = (aiFace *)(puVar38 + 1);
            if (2 < local_f8) {
              paVar39 = paVar59;
              do {
                paVar39->mNumIndices = 0;
                paVar39->mIndices = (uint *)0x0;
                paVar39 = paVar39 + 1;
              } while (paVar39 != paVar59 + uVar54);
            }
            uVar46 = local_c8;
            if (local_58 != 0) {
              uVar23 = 0;
              local_b8 = paVar59;
              do {
                uVar49 = (ulong)uVar23 * 0xaaaaaaab >> 0x1d & 0xfffffffffffffff0;
                uVar55 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar23);
                uVar26 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar23 + 1);
                uVar25 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar23 + 2);
                *(undefined4 *)((long)&local_b8->mNumIndices + uVar49) = 3;
                puVar41 = (uint *)operator_new__(0xc);
                *(uint **)((long)&local_b8->mIndices + uVar49) = puVar41;
                *puVar41 = uVar55;
                puVar41[1] = uVar26;
                puVar41[2] = uVar25;
                uVar55 = uVar23 + 3;
                uVar23 = uVar23 + 3;
                paVar59 = local_b8;
              } while (uVar55 < local_58);
              goto LAB_00664425;
            }
            break;
          case PrimitiveMode_TRIANGLE_STRIP:
            uVar54 = local_f8 - 2;
            uVar46 = uVar54 * 0x10 + 8;
            if (0xfffffffffffffff < uVar54) {
              uVar46 = 0xffffffffffffffff;
            }
            local_f8 = uVar54;
            puVar38 = (ulong *)operator_new__(uVar46);
            *puVar38 = local_f8;
            paVar59 = (aiFace *)(puVar38 + 1);
            uVar46 = local_f8;
            if (local_f8 != 0) {
              paVar39 = paVar59;
              do {
                paVar39->mNumIndices = 0;
                paVar39->mIndices = (uint *)0x0;
                paVar39 = paVar39 + 1;
              } while (paVar39 != paVar59 + uVar54);
              uVar49 = 0;
              uVar23 = 1;
              local_b8 = paVar59;
              do {
                uVar26 = uVar23 - 1;
                paVar59 = local_b8 + uVar49;
                uVar55 = uVar23 + 1;
                if ((uVar26 & 1) == 0) {
                  uVar24 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar26);
                  uVar26 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar23);
                  uVar25 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar55);
                  paVar59->mNumIndices = 3;
                  puVar41 = (uint *)operator_new__(0xc);
                }
                else {
                  uVar24 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar23);
                  uVar26 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar26);
                  uVar25 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,uVar55);
                  paVar59->mNumIndices = 3;
                  puVar41 = (uint *)operator_new__(0xc);
                }
                paVar59->mIndices = puVar41;
                *puVar41 = uVar24;
                puVar41[1] = uVar26;
                puVar41[2] = uVar25;
                uVar49 = (ulong)uVar23;
                paVar59 = local_b8;
                uVar46 = local_f8;
                uVar23 = uVar55;
              } while (uVar49 < local_f8);
              goto LAB_00664acb;
            }
            break;
          case PrimitiveMode_TRIANGLE_FAN:
            uVar46 = local_f8 - 2;
            uVar49 = uVar46 * 0x10 + 8;
            if (0xfffffffffffffff < uVar46) {
              uVar49 = 0xffffffffffffffff;
            }
            local_f8 = uVar46;
            paVar39 = (aiFace *)operator_new__(uVar49);
            *(ulong *)paVar39 = local_f8;
            paVar59 = (aiFace *)&paVar39->mIndices;
            if (local_f8 != 0) {
              ppuVar40 = (uint **)paVar59;
              do {
                *(undefined4 *)ppuVar40 = 0;
                ppuVar40[1] = (uint *)0x0;
                ppuVar40 = ppuVar40 + 2;
              } while (ppuVar40 != (uint **)((long)paVar59 + uVar46 * 2 * 8));
            }
            uVar23 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,0);
            uVar55 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,1);
            uVar26 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,2);
            *(undefined4 *)paVar59 = 3;
            puVar41 = (uint *)operator_new__(0xc);
            *(uint **)(paVar39 + 1) = puVar41;
            *puVar41 = uVar23;
            puVar41[1] = uVar55;
            puVar41[2] = uVar26;
            uVar49 = local_100;
            uVar46 = local_f8;
            if (1 < local_f8) {
              uVar49 = 1;
              iVar51 = 3;
              local_b8 = paVar39;
              do {
                uVar23 = **(uint **)(local_b8 + 1);
                uVar55 = *(uint *)(*(ulong *)(paVar39 + (ulong)(iVar51 - 3) + 1) + 8);
                uVar26 = glTF2::Accessor::Indexer::GetValue<unsigned_int>(&local_e8,iVar51);
                *(undefined4 *)((long)paVar59 + uVar49 * 2 * 8) = 3;
                puVar41 = (uint *)operator_new__(0xc);
                *(uint **)((long)paVar59 + (uVar49 * 2 + 1) * 8) = puVar41;
                *puVar41 = uVar23;
                puVar41[1] = uVar55;
                puVar41[2] = uVar26;
                uVar49 = (ulong)(iVar51 - 1);
                iVar51 = iVar51 + 1;
                uVar46 = local_f8;
              } while (uVar49 < local_f8);
              goto LAB_00664acb;
            }
            break;
          default:
switchD_00663fe8_default:
            uVar23 = 0;
            paVar59 = (aiFace *)0x0;
            goto LAB_00664ba6;
          }
          uVar23 = (uint)uVar46;
LAB_00664ba6:
          if (paVar59 != (aiFace *)0x0) {
            local_108->mFaces = paVar59;
            local_108->mNumFaces = uVar23;
            bVar61 = uVar23 == 0;
            if (!bVar61) {
              uVar46 = 0;
              bVar61 = false;
              do {
                uVar54 = (ulong)paVar59[uVar46].mNumIndices;
                if (uVar54 != 0) {
                  if (local_108->mNumVertices <= *paVar59[uVar46].mIndices) break;
                  uVar48 = 0;
                  do {
                    if (uVar54 - 1 == uVar48) goto LAB_00664c08;
                    uVar50 = uVar48 + 1;
                    lVar45 = uVar48 + 1;
                    uVar48 = uVar50;
                  } while (paVar59[uVar46].mIndices[lVar45] < local_108->mNumVertices);
                  if (uVar50 < uVar54) break;
                }
LAB_00664c08:
                uVar46 = uVar46 + 1;
                bVar61 = uVar23 <= uVar46;
              } while (uVar46 != uVar23);
            }
            if (!bVar61) {
              __assert_fail("CheckValidFacesIndices(faces, static_cast<unsigned>(nFaces), aim->mNumVertices)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF2/glTF2Importer.cpp"
                            ,0x281,"void Assimp::glTF2Importer::ImportMeshes(glTF2::Asset &)");
            }
          }
          if ((local_f0->material).vector ==
              (vector<glTF2::Material_*,_std::allocator<glTF2::Material_*>_> *)0x0) {
            uVar23 = local_a8->mScene->mNumMaterials - 1;
          }
          else {
            uVar23 = (local_f0->material).index;
          }
          local_108->mMaterialIndex = uVar23;
          local_a0 = (ulong)((int)local_a0 + 1);
          pPVar58 = (local_b0->primitives).
                    super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (local_a0 <
                 (ulong)((long)*(pointer *)
                                ((long)&(local_b0->primitives).
                                        super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                                        ._M_impl + 8) - (long)pPVar58 >> 8));
      }
      uVar49 = uVar49 + 1;
      ppMVar27 = (local_40->meshes).mObjs.
                 super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar49 < ((ulong)((long)(local_40->meshes).mObjs.
                                     super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar27) >>
                       3 & 0xffffffff));
  }
  pgVar21 = local_a8;
  iVar12._M_current =
       (local_a8->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar12._M_current ==
      (local_a8->meshOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_a8->meshOffsets,iVar12,
               &local_bc);
  }
  else {
    *iVar12._M_current = local_bc;
    ppuVar1 = &(local_a8->meshOffsets).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  iVar22._M_current = iStack_70._M_current;
  ppaVar53 = local_78;
  paVar19 = pgVar21->mScene;
  uVar23 = (uint)((ulong)((long)iStack_70._M_current - (long)local_78) >> 3);
  paVar19->mNumMeshes = uVar23;
  if (uVar23 != 0) {
    ppaVar44 = (aiMesh **)operator_new__((long)iStack_70._M_current - (long)local_78 & 0x7fffffff8);
    paVar19->mMeshes = ppaVar44;
    for (; ppaVar53 != iVar22._M_current; ppaVar53 = ppaVar53 + 1) {
      paVar28 = *ppaVar53;
      *ppaVar53 = *ppaVar44;
      *ppaVar44 = paVar28;
      ppaVar44 = ppaVar44 + 1;
    }
  }
  if (local_78 != (aiMesh **)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  return;
}

Assistant:

void glTF2Importer::ImportMeshes(glTF2::Asset &r) {
	std::vector<aiMesh *> meshes;

	unsigned int k = 0;

	for (unsigned int m = 0; m < r.meshes.Size(); ++m) {
		Mesh &mesh = r.meshes[m];

		meshOffsets.push_back(k);
		k += unsigned(mesh.primitives.size());

		for (unsigned int p = 0; p < mesh.primitives.size(); ++p) {
			Mesh::Primitive &prim = mesh.primitives[p];

			aiMesh *aim = new aiMesh();
			meshes.push_back(aim);

			aim->mName = mesh.name.empty() ? mesh.id : mesh.name;

			if (mesh.primitives.size() > 1) {
				ai_uint32 &len = aim->mName.length;
				aim->mName.data[len] = '-';
				len += 1 + ASSIMP_itoa10(aim->mName.data + len + 1, unsigned(MAXLEN - len - 1), p);
			}

			switch (prim.mode) {
				case PrimitiveMode_POINTS:
					aim->mPrimitiveTypes |= aiPrimitiveType_POINT;
					break;

				case PrimitiveMode_LINES:
				case PrimitiveMode_LINE_LOOP:
				case PrimitiveMode_LINE_STRIP:
					aim->mPrimitiveTypes |= aiPrimitiveType_LINE;
					break;

				case PrimitiveMode_TRIANGLES:
				case PrimitiveMode_TRIANGLE_STRIP:
				case PrimitiveMode_TRIANGLE_FAN:
					aim->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
					break;
			}

			Mesh::Primitive::Attributes &attr = prim.attributes;

			if (attr.position.size() > 0 && attr.position[0]) {
				aim->mNumVertices = static_cast<unsigned int>(attr.position[0]->count);
				attr.position[0]->ExtractData(aim->mVertices);
			}

			if (attr.normal.size() > 0 && attr.normal[0]) {
				attr.normal[0]->ExtractData(aim->mNormals);

				// only extract tangents if normals are present
				if (attr.tangent.size() > 0 && attr.tangent[0]) {
					// generate bitangents from normals and tangents according to spec
					Tangent *tangents = nullptr;

					attr.tangent[0]->ExtractData(tangents);

					aim->mTangents = new aiVector3D[aim->mNumVertices];
					aim->mBitangents = new aiVector3D[aim->mNumVertices];

					for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
						aim->mTangents[i] = tangents[i].xyz;
						aim->mBitangents[i] = (aim->mNormals[i] ^ tangents[i].xyz) * tangents[i].w;
					}

					delete[] tangents;
				}
			}

			for (size_t c = 0; c < attr.color.size() && c < AI_MAX_NUMBER_OF_COLOR_SETS; ++c) {
				if (attr.color[c]->count != aim->mNumVertices) {
					DefaultLogger::get()->warn("Color stream size in mesh \"" + mesh.name +
											   "\" does not match the vertex count");
					continue;
				}
				attr.color[c]->ExtractData(aim->mColors[c]);
			}
			for (size_t tc = 0; tc < attr.texcoord.size() && tc < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++tc) {
				if (attr.texcoord[tc]->count != aim->mNumVertices) {
					DefaultLogger::get()->warn("Texcoord stream size in mesh \"" + mesh.name +
											   "\" does not match the vertex count");
					continue;
				}

				attr.texcoord[tc]->ExtractData(aim->mTextureCoords[tc]);
				aim->mNumUVComponents[tc] = attr.texcoord[tc]->GetNumComponents();

				aiVector3D *values = aim->mTextureCoords[tc];
				for (unsigned int i = 0; i < aim->mNumVertices; ++i) {
					values[i].y = 1 - values[i].y; // Flip Y coords
				}
			}

			std::vector<Mesh::Primitive::Target> &targets = prim.targets;
			if (targets.size() > 0) {
				aim->mNumAnimMeshes = (unsigned int)targets.size();
				aim->mAnimMeshes = new aiAnimMesh *[aim->mNumAnimMeshes];
				for (size_t i = 0; i < targets.size(); i++) {
					aim->mAnimMeshes[i] = aiCreateAnimMesh(aim);
					aiAnimMesh &aiAnimMesh = *(aim->mAnimMeshes[i]);
					Mesh::Primitive::Target &target = targets[i];

					if (target.position.size() > 0) {
						aiVector3D *positionDiff = nullptr;
						target.position[0]->ExtractData(positionDiff);
						for (unsigned int vertexId = 0; vertexId < aim->mNumVertices; vertexId++) {
							aiAnimMesh.mVertices[vertexId] += positionDiff[vertexId];
						}
						delete[] positionDiff;
					}
					if (target.normal.size() > 0) {
						aiVector3D *normalDiff = nullptr;
						target.normal[0]->ExtractData(normalDiff);
						for (unsigned int vertexId = 0; vertexId < aim->mNumVertices; vertexId++) {
							aiAnimMesh.mNormals[vertexId] += normalDiff[vertexId];
						}
						delete[] normalDiff;
					}
					if (target.tangent.size() > 0) {
						Tangent *tangent = nullptr;
						attr.tangent[0]->ExtractData(tangent);

						aiVector3D *tangentDiff = nullptr;
						target.tangent[0]->ExtractData(tangentDiff);

						for (unsigned int vertexId = 0; vertexId < aim->mNumVertices; ++vertexId) {
							tangent[vertexId].xyz += tangentDiff[vertexId];
							aiAnimMesh.mTangents[vertexId] = tangent[vertexId].xyz;
							aiAnimMesh.mBitangents[vertexId] = (aiAnimMesh.mNormals[vertexId] ^ tangent[vertexId].xyz) * tangent[vertexId].w;
						}
						delete[] tangent;
						delete[] tangentDiff;
					}
					if (mesh.weights.size() > i) {
						aiAnimMesh.mWeight = mesh.weights[i];
					}
				}
			}

			aiFace *faces = nullptr;
			size_t nFaces = 0;

			if (prim.indices) {
				size_t count = prim.indices->count;

				Accessor::Indexer data = prim.indices->GetIndexer();
				ai_assert(data.IsValid());

				switch (prim.mode) {
					case PrimitiveMode_POINTS: {
						nFaces = count;
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; ++i) {
							SetFace(faces[i], data.GetUInt(i));
						}
						break;
					}

					case PrimitiveMode_LINES: {
						nFaces = count / 2;
						if (nFaces * 2 != count) {
							ASSIMP_LOG_WARN("The number of vertices was not compatible with the LINES mode. Some vertices were dropped.");
							count = nFaces * 2;
						}
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; i += 2) {
							SetFace(faces[i / 2], data.GetUInt(i), data.GetUInt(i + 1));
						}
						break;
					}

					case PrimitiveMode_LINE_LOOP:
					case PrimitiveMode_LINE_STRIP: {
						nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
						faces = new aiFace[nFaces];
						SetFace(faces[0], data.GetUInt(0), data.GetUInt(1));
						for (unsigned int i = 2; i < count; ++i) {
							SetFace(faces[i - 1], faces[i - 2].mIndices[1], data.GetUInt(i));
						}
						if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
							SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
						}
						break;
					}

					case PrimitiveMode_TRIANGLES: {
						nFaces = count / 3;
						if (nFaces * 3 != count) {
							ASSIMP_LOG_WARN("The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped.");
							count = nFaces * 3;
						}
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; i += 3) {
							SetFace(faces[i / 3], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
						}
						break;
					}
					case PrimitiveMode_TRIANGLE_STRIP: {
						nFaces = count - 2;
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < nFaces; ++i) {
							//The ordering is to ensure that the triangles are all drawn with the same orientation
							if ((i + 1) % 2 == 0) {
								//For even n, vertices n + 1, n, and n + 2 define triangle n
								SetFace(faces[i], data.GetUInt(i + 1), data.GetUInt(i), data.GetUInt(i + 2));
							} else {
								//For odd n, vertices n, n+1, and n+2 define triangle n
								SetFace(faces[i], data.GetUInt(i), data.GetUInt(i + 1), data.GetUInt(i + 2));
							}
						}
						break;
					}
					case PrimitiveMode_TRIANGLE_FAN:
						nFaces = count - 2;
						faces = new aiFace[nFaces];
						SetFace(faces[0], data.GetUInt(0), data.GetUInt(1), data.GetUInt(2));
						for (unsigned int i = 1; i < nFaces; ++i) {
							SetFace(faces[i], faces[0].mIndices[0], faces[i - 1].mIndices[2], data.GetUInt(i + 2));
						}
						break;
				}
			} else { // no indices provided so directly generate from counts

				// use the already determined count as it includes checks
				unsigned int count = aim->mNumVertices;

				switch (prim.mode) {
					case PrimitiveMode_POINTS: {
						nFaces = count;
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; ++i) {
							SetFace(faces[i], i);
						}
						break;
					}

					case PrimitiveMode_LINES: {
						nFaces = count / 2;
						if (nFaces * 2 != count) {
							ASSIMP_LOG_WARN("The number of vertices was not compatible with the LINES mode. Some vertices were dropped.");
							count = (unsigned int)nFaces * 2;
						}
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; i += 2) {
							SetFace(faces[i / 2], i, i + 1);
						}
						break;
					}

					case PrimitiveMode_LINE_LOOP:
					case PrimitiveMode_LINE_STRIP: {
						nFaces = count - ((prim.mode == PrimitiveMode_LINE_STRIP) ? 1 : 0);
						faces = new aiFace[nFaces];
						SetFace(faces[0], 0, 1);
						for (unsigned int i = 2; i < count; ++i) {
							SetFace(faces[i - 1], faces[i - 2].mIndices[1], i);
						}
						if (prim.mode == PrimitiveMode_LINE_LOOP) { // close the loop
							SetFace(faces[count - 1], faces[count - 2].mIndices[1], faces[0].mIndices[0]);
						}
						break;
					}

					case PrimitiveMode_TRIANGLES: {
						nFaces = count / 3;
						if (nFaces * 3 != count) {
							ASSIMP_LOG_WARN("The number of vertices was not compatible with the TRIANGLES mode. Some vertices were dropped.");
							count = (unsigned int)nFaces * 3;
						}
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < count; i += 3) {
							SetFace(faces[i / 3], i, i + 1, i + 2);
						}
						break;
					}
					case PrimitiveMode_TRIANGLE_STRIP: {
						nFaces = count - 2;
						faces = new aiFace[nFaces];
						for (unsigned int i = 0; i < nFaces; ++i) {
							//The ordering is to ensure that the triangles are all drawn with the same orientation
							if ((i + 1) % 2 == 0) {
								//For even n, vertices n + 1, n, and n + 2 define triangle n
								SetFace(faces[i], i + 1, i, i + 2);
							} else {
								//For odd n, vertices n, n+1, and n+2 define triangle n
								SetFace(faces[i], i, i + 1, i + 2);
							}
						}
						break;
					}
					case PrimitiveMode_TRIANGLE_FAN:
						nFaces = count - 2;
						faces = new aiFace[nFaces];
						SetFace(faces[0], 0, 1, 2);
						for (unsigned int i = 1; i < nFaces; ++i) {
							SetFace(faces[i], faces[0].mIndices[0], faces[i - 1].mIndices[2], i + 2);
						}
						break;
				}
			}

			if (nullptr != faces) {
				aim->mFaces = faces;
				aim->mNumFaces = static_cast<unsigned int>(nFaces);
				ai_assert(CheckValidFacesIndices(faces, static_cast<unsigned>(nFaces), aim->mNumVertices));
			}

			if (prim.material) {
				aim->mMaterialIndex = prim.material.GetIndex();
			} else {
				aim->mMaterialIndex = mScene->mNumMaterials - 1;
			}
		}
	}

	meshOffsets.push_back(k);

	CopyVector(meshes, mScene->mMeshes, mScene->mNumMeshes);
}